

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_inl.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapBegin
          (TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,
          MapIterator *map_iter)

{
  int iVar1;
  undefined4 extraout_var;
  const_iterator *pcVar2;
  const_iterator local_30;
  MapIterator *local_18;
  MapIterator *map_iter_local;
  TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_local;
  
  local_18 = map_iter;
  map_iter_local = (MapIterator *)this;
  iVar1 = (*(this->super_MapFieldBase)._vptr_MapFieldBase[0x15])();
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin
            (&local_30,
             (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
             CONCAT44(extraout_var,iVar1));
  pcVar2 = InternalGetIterator(this,local_18);
  (pcVar2->it_).node_ = local_30.it_.node_;
  (pcVar2->it_).m_ = local_30.it_.m_;
  (pcVar2->it_).bucket_index_ = local_30.it_.bucket_index_;
  (*(this->super_MapFieldBase)._vptr_MapFieldBase[0x17])(this,local_18);
  return;
}

Assistant:

void TypeDefinedMapFieldBase<Key, T>::MapBegin(MapIterator* map_iter) const {
  InternalGetIterator(map_iter) = GetMap().begin();
  SetMapIteratorValue(map_iter);
}